

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

void __thiscall Js::AsmJsModuleInfo::SetFunctionTableCount(AsmJsModuleInfo *this,int val)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this_00;
  ModuleFunctionTable *ptr;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if ((this->mFunctionTables).ptr != (ModuleFunctionTable *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                ,0x675,"(mFunctionTables == nullptr)","mFunctionTables == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->mFunctionTableCount = val;
  local_48 = (undefined1  [8])&ModuleFunctionTable::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_459a7a9;
  data.filename._0_4_ = 0x677;
  data.plusSize = (long)val;
  this_00 = Memory::Recycler::TrackAllocInfo(this->mRecycler,(TrackAllocData *)local_48);
  ptr = Memory::AllocateArray<Memory::Recycler,Js::AsmJsModuleInfo::ModuleFunctionTable,false>
                  ((Memory *)this_00,(Recycler *)Memory::Recycler::Alloc,0,(long)val);
  Memory::WriteBarrierPtr<Js::AsmJsModuleInfo::ModuleFunctionTable>::WriteBarrierSet
            (&this->mFunctionTables,ptr);
  return;
}

Assistant:

void AsmJsModuleInfo::SetFunctionTableCount(int val)
    {
        Assert(mFunctionTables == nullptr);
        mFunctionTableCount = val;
        mFunctionTables = RecyclerNewArray(mRecycler, ModuleFunctionTable, val);
    }